

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

int make_pack(mixed_encoding encoding,int channels,mixed_pack *pack)

{
  int iVar1;
  uint32_t i;
  ulong uVar2;
  uint32_t size;
  char *buffer;
  
  pack->encoding = encoding;
  pack->channels = (mixed_channel_t)channels;
  pack->samplerate = 48000;
  iVar1 = mixed_make_pack(500,pack);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    size = 0xffffffff;
    mixed_pack_request_write(&buffer,&size,pack);
    for (uVar2 = 0; uVar2 < size; uVar2 = uVar2 + 1) {
      iVar1 = rand();
      buffer[uVar2] = (char)((long)iVar1 % 0x80);
    }
    mixed_pack_finish_write((ulong)size,pack);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int make_pack(enum mixed_encoding encoding, int channels, struct mixed_pack *pack){
  pack->encoding = encoding;
  pack->channels = channels;
  pack->samplerate = 1;
  if(!mixed_make_pack(16, pack))
    return 0;
  char *buffer;
  uint32_t size = UINT32_MAX;
  mixed_pack_request_write((void**)&buffer, &size, pack);
  for(uint32_t i=0; i<size; ++i)
    buffer[i] = rand()%128;
  mixed_pack_finish_write(size, pack);
  return 1;
}